

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_timesamples<int>
                   (string *__return_storage_ptr__,TypedTimeSamples<int> *v,uint32_t indent)

{
  pointer pSVar1;
  vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  *pvVar2;
  ostream *poVar3;
  uint32_t extraout_EDX;
  uint32_t n;
  uint32_t extraout_EDX_00;
  long lVar4;
  size_t i;
  ulong uVar5;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{\n");
  pvVar2 = TypedTimeSamples<int>::get_samples(v);
  lVar4 = 0;
  n = extraout_EDX;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(pvVar2->
                            super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar2->
                            super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(indent + 1),n);
    std::operator<<(local_1a8,(string *)&local_1d8);
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&((pvVar2->
                                  super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->t + lVar4));
    std::operator<<(poVar3,": ");
    std::__cxx11::string::_M_dispose();
    pSVar1 = (pvVar2->
             super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((&pSVar1->blocked)[lVar4] == true) {
      std::operator<<(local_1a8,"None");
    }
    else {
      std::ostream::operator<<(local_1a8,*(int *)((long)&pSVar1->value + lVar4));
    }
    std::operator<<(local_1a8,",\n");
    lVar4 = lVar4 + 0x10;
    n = extraout_EDX_00;
  }
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
  poVar3 = std::operator<<(local_1a8,(string *)&local_1d8);
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}